

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Create_Entity_R_PDU.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::Create_Entity_R_PDU::Decode
          (Create_Entity_R_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  KUINT16 KVar1;
  KException *this_00;
  int iVar2;
  undefined7 in_register_00000011;
  allocator<char> local_39;
  KString local_38;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  iVar2 = 0xc;
  if ((int)CONCAT71(in_register_00000011,ignoreHeader) == 0) {
    iVar2 = 0;
  }
  if (0x1f < iVar2 + (uint)KVar1) {
    Simulation_Management_Header::Decode((Simulation_Management_Header *)this,stream,ignoreHeader);
    Reliability_Header::Decode(&this->super_Reliability_Header,stream);
    KDataStream::Read<unsigned_int>(stream,&(this->super_Create_Entity_PDU).m_ui32RequestID);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Decode",&local_39);
  KException::KException(this_00,&local_38,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void Create_Entity_R_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < CREATE_ENTITY_R_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    Simulation_Management_Header::Decode( stream, ignoreHeader );

    Reliability_Header::Decode( stream );

    stream >> m_ui32RequestID;
}